

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

int cookie_sort(void *p1,void *p2)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  
  lVar1 = *p1;
  lVar2 = *p2;
  if (*(char **)(lVar1 + 0x18) == (char *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = strlen(*(char **)(lVar1 + 0x18));
  }
  if (*(char **)(lVar2 + 0x18) == (char *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = strlen(*(char **)(lVar2 + 0x18));
  }
  bVar5 = sVar3 < uVar4;
  if (sVar3 == uVar4) {
    if (*(char **)(lVar1 + 0x28) == (char *)0x0) {
      sVar3 = 0;
    }
    else {
      sVar3 = strlen(*(char **)(lVar1 + 0x28));
    }
    if (*(char **)(lVar2 + 0x28) == (char *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = strlen(*(char **)(lVar2 + 0x28));
    }
    bVar5 = sVar3 < uVar4;
    if (sVar3 == uVar4) {
      if (*(char **)(lVar1 + 8) == (char *)0x0) {
        sVar3 = 0;
      }
      else {
        sVar3 = strlen(*(char **)(lVar1 + 8));
      }
      if (*(char **)(lVar2 + 8) == (char *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = strlen(*(char **)(lVar2 + 8));
      }
      bVar5 = sVar3 < uVar4;
      if (sVar3 == uVar4) {
        bVar5 = *(int *)(lVar1 + 0x3c) < *(int *)(lVar2 + 0x3c);
      }
    }
  }
  return bVar5 - 1 | 1;
}

Assistant:

static int cookie_sort(const void *p1, const void *p2)
{
  struct Cookie *c1 = *(struct Cookie **)p1;
  struct Cookie *c2 = *(struct Cookie **)p2;
  size_t l1, l2;

  /* 1 - compare cookie path lengths */
  l1 = c1->path ? strlen(c1->path) : 0;
  l2 = c2->path ? strlen(c2->path) : 0;

  if(l1 != l2)
    return (l2 > l1) ? 1 : -1 ; /* avoid size_t <=> int conversions */

  /* 2 - compare cookie domain lengths */
  l1 = c1->domain ? strlen(c1->domain) : 0;
  l2 = c2->domain ? strlen(c2->domain) : 0;

  if(l1 != l2)
    return (l2 > l1) ? 1 : -1 ;  /* avoid size_t <=> int conversions */

  /* 3 - compare cookie name lengths */
  l1 = c1->name ? strlen(c1->name) : 0;
  l2 = c2->name ? strlen(c2->name) : 0;

  if(l1 != l2)
    return (l2 > l1) ? 1 : -1;

  /* 4 - compare cookie creation time */
  return (c2->creationtime > c1->creationtime) ? 1 : -1;
}